

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pg_functions.cpp
# Opt level: O3

void * duckdb_libpgquery::palloc(size_t n)

{
  size_t *psVar1;
  long lVar2;
  long lVar3;
  ulong n_00;
  size_t *__s;
  
  n_00 = n + 0xf & 0xfffffffffffffff8;
  lVar2 = __tls_get_addr(&PTR_0248ae98);
  lVar3 = *(long *)(lVar2 + 0x2a60);
  if (0x2800 < lVar3 + n_00) {
    allocate_new((parser_state *)(lVar2 + 0xa58),n_00);
    lVar3 = *(long *)(lVar2 + 0x2a60);
  }
  psVar1 = (size_t *)
           (*(long *)(*(long *)(lVar2 + 0x2a70) + -8 + *(long *)(lVar2 + 0x2a68) * 8) + lVar3);
  __s = psVar1 + 1;
  *psVar1 = n;
  switchD_012e3010::default(__s,0,n);
  *(long *)(lVar2 + 0x2a60) = *(long *)(lVar2 + 0x2a60) + n_00;
  return __s;
}

Assistant:

void *palloc(size_t n) {
	// we need to align our pointers for the sanitizer
	auto allocate_n = n + sizeof(size_t);
	auto aligned_n = ((allocate_n + 7) / 8) * 8;
	if (pg_parser_state.malloc_pos + aligned_n > PG_MALLOC_SIZE) {
		allocate_new(&pg_parser_state, aligned_n);
	}

	// store the length of the allocation
	char *base_ptr = pg_parser_state.malloc_ptrs[pg_parser_state.malloc_ptr_idx - 1] + pg_parser_state.malloc_pos;
	memcpy(base_ptr, &n, sizeof(size_t));
	// store the actual pointer
	char *ptr = (char*) base_ptr + sizeof(size_t);
	memset(ptr, 0, n);
	pg_parser_state.malloc_pos += aligned_n;
	return ptr;
}